

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

char * nlohmann::json_abi_v3_11_2::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  
  if (-1 < min_exp) {
    __assert_fail("min_exp < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                  ,0x4566,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (0 < max_exp) {
    uVar3 = decimal_exponent + len;
    if (max_exp < (int)uVar3 || decimal_exponent < 0) {
      if ((int)uVar3 < 1 || max_exp < (int)uVar3) {
        if ((int)uVar3 <= min_exp || 0 < (int)uVar3) {
          if (len != 1) {
            memmove(buf + 2,buf + 1,(long)len - 1);
            buf[1] = '.';
            buf = buf + len;
          }
          buf[1] = 'e';
          pcVar1 = append_exponent(buf + 2,uVar3 - 1);
          return pcVar1;
        }
        memmove(buf + (ulong)-uVar3 + 2,buf,(long)len);
        buf[0] = '0';
        buf[1] = '.';
        memset(buf + 2,0x30,(ulong)-uVar3);
        pcVar4 = buf + (ulong)-uVar3 + 2 + len;
      }
      else {
        if (-1 < decimal_exponent) {
          __assert_fail("k > n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                        ,0x4581,
                        "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)"
                       );
        }
        uVar2 = (ulong)uVar3;
        memmove(buf + uVar2 + 1,buf + uVar2,(uint)len - uVar2);
        buf[uVar2] = '.';
        pcVar4 = buf + (ulong)(uint)len + 1;
      }
    }
    else {
      memset(buf + len,0x30,(long)(int)uVar3 - (long)len);
      pcVar1 = buf + (int)uVar3;
      pcVar4 = pcVar1 + 2;
      pcVar1[0] = '.';
      pcVar1[1] = '0';
    }
    return pcVar4;
  }
  __assert_fail("max_exp > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                ,0x4567,
                "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    JSON_ASSERT(min_exp < 0);
    JSON_ASSERT(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n && n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n) - static_cast<size_t>(k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (static_cast<size_t>(n) + 2);
    }

    if (0 < n && n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        JSON_ASSERT(k > n);

        std::memmove(buf + (static_cast<size_t>(n) + 1), buf + n, static_cast<size_t>(k) - static_cast<size_t>(n));
        buf[n] = '.';
        return buf + (static_cast<size_t>(k) + 1U);
    }

    if (min_exp < n && n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + static_cast<size_t>(-n)), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2U + static_cast<size_t>(-n) + static_cast<size_t>(k));
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k) - 1);
        buf[1] = '.';
        buf += 1 + static_cast<size_t>(k);
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}